

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.hpp
# Opt level: O1

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
kainjow::mustache::html_escape<std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,mustache *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s)

{
  ulong uVar1;
  byte bVar2;
  long lVar3;
  long lVar4;
  undefined8 uVar5;
  undefined8 in_RAX;
  long lVar6;
  undefined8 uStack_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  uStack_38 = in_RAX;
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  lVar3 = *(long *)(this + 8);
  if (lVar3 != 0) {
    lVar4 = *(long *)this;
    lVar6 = 0;
    uVar1 = (long)&uStack_38 + 2;
    do {
      uVar5 = uStack_38;
      bVar2 = *(byte *)(lVar4 + lVar6);
      if (bVar2 < 0x27) {
        if (bVar2 == 0x22) {
          uStack_38._0_6_ = CONCAT42(0x6f757126,(undefined2)uStack_38);
          uStack_38 = CONCAT26(0x3b74,(undefined6)uStack_38);
          std::__cxx11::string::append((char *)__return_storage_ptr__,uVar1);
        }
        else if (bVar2 == 0x26) {
          uStack_38._0_6_ = CONCAT42(0x706d6126,(undefined2)uStack_38);
          uStack_38._7_1_ = SUB81(uVar5,7);
          uStack_38._0_7_ = CONCAT16(0x3b,(undefined6)uStack_38);
          std::__cxx11::string::append((char *)__return_storage_ptr__,uVar1);
        }
        else {
LAB_001dc616:
          std::__cxx11::string::_M_replace_aux
                    ((ulong)__return_storage_ptr__,__return_storage_ptr__->_M_string_length,0,'\x01'
                    );
        }
      }
      else if (bVar2 == 0x27) {
        uStack_38._0_6_ = CONCAT42(0x6f706126,(undefined2)uStack_38);
        uStack_38 = CONCAT26(0x3b73,(undefined6)uStack_38);
        std::__cxx11::string::append((char *)__return_storage_ptr__,uVar1);
      }
      else if (bVar2 == 0x3c) {
        uStack_38._0_6_ = CONCAT42(0x3b746c26,(undefined2)uStack_38);
        std::__cxx11::string::append((char *)__return_storage_ptr__,uVar1);
      }
      else {
        if (bVar2 != 0x3e) goto LAB_001dc616;
        uStack_38._0_6_ = CONCAT42(0x3b746726,(undefined2)uStack_38);
        std::__cxx11::string::append((char *)__return_storage_ptr__,uVar1);
      }
      lVar6 = lVar6 + 1;
    } while (lVar3 != lVar6);
  }
  return __return_storage_ptr__;
}

Assistant:

string_type html_escape(const string_type& s) {
    string_type ret;
    ret.reserve(s.size()*2);
    for (const auto ch : s) {
        switch (ch) {
            case '&':
                ret.append({'&','a','m','p',';'});
                break;
            case '<':
                ret.append({'&','l','t',';'});
                break;
            case '>':
                ret.append({'&','g','t',';'});
                break;
            case '\"':
                ret.append({'&','q','u','o','t',';'});
                break;
            case '\'':
                ret.append({'&','a','p','o','s',';'});
                break;
            default:
                ret.append(1, ch);
                break;
        }
    }
    return ret;
}